

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Vec3i __thiscall embree::XMLLoader::load<embree::Vec3<int>>(XMLLoader *this,Ref<embree::XML> *xml)

{
  Token *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  runtime_error *this_01;
  long *plVar4;
  long *plVar5;
  undefined4 extraout_EDX;
  long *in_RDX;
  Vec3i VVar6;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  string local_40;
  
  this_00 = *(Token **)(*in_RDX + 0x98);
  if (*(long *)(*in_RDX + 0xa0) - (long)this_00 == 0xd8) {
    iVar1 = Token::Int(this_00);
    iVar2 = Token::Int((Token *)(*(long *)(*in_RDX + 0x98) + 0x48));
    iVar3 = Token::Int((Token *)(*(long *)(*in_RDX + 0x98) + 0x90));
    *(int *)&(this->path).filename._M_dataplus._M_p = iVar1;
    *(int *)((long)&(this->path).filename._M_dataplus._M_p + 4) = iVar2;
    *(int *)&(this->path).filename._M_string_length = iVar3;
    VVar6.field_0.field_0.z = extraout_EDX;
    VVar6.field_0._0_8_ = this;
    return (Vec3i)VVar6.field_0;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_40,(ParseLocation *)(*in_RDX + 0x10));
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60 = (long *)*plVar4;
  plVar5 = plVar4 + 2;
  if (local_60 == plVar5) {
    local_50 = *plVar5;
    lStack_48 = plVar4[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar5;
  }
  local_58 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error(this_01,(string *)&local_60);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vec3i XMLLoader::load<Vec3i>(const Ref<XML>& xml) {
    if (xml->body.size() != 3) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong int3 body");
    return Vec3i(xml->body[0].Int(),xml->body[1].Int(),xml->body[2].Int());
  }